

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cleanup_state.cpp
# Opt level: O3

void __thiscall duckdb::CleanupState::CleanupDelete(CleanupState *this,DeleteInfo *info)

{
  ushort uVar1;
  DataTable *this_00;
  idx_t iVar2;
  idx_t iVar3;
  bool bVar4;
  mapped_type *pmVar5;
  ulong uVar6;
  uint16_t *puVar7;
  string local_40;
  
  this_00 = info->table;
  bVar4 = DataTable::HasIndexes(this_00);
  if (bVar4) {
    if ((this->current_table).ptr != this_00) {
      Flush(this);
      (this->current_table).ptr = this_00;
    }
    optional_ptr<duckdb::DataTable,_true>::CheckValid(&this->current_table);
    DataTable::GetTableName_abi_cxx11_(&local_40,(this->current_table).ptr);
    pmVar5 = ::std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::optional_ptr<duckdb::DataTable,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::optional_ptr<duckdb::DataTable,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::optional_ptr<duckdb::DataTable,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::optional_ptr<duckdb::DataTable,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this,&local_40);
    pmVar5->ptr = (this->current_table).ptr;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    this->count = 0;
    if (info->is_consecutive == true) {
      if (info->count != 0) {
        uVar6 = 0;
        do {
          iVar2 = info->base_row;
          iVar3 = this->count;
          this->count = iVar3 + 1;
          this->row_numbers[iVar3] = iVar2 + uVar6;
          uVar6 = uVar6 + 1;
        } while (uVar6 < info->count);
      }
    }
    else {
      puVar7 = DeleteInfo::GetRows(info);
      if (info->count != 0) {
        uVar6 = 0;
        do {
          uVar1 = puVar7[uVar6];
          iVar2 = info->base_row;
          iVar3 = this->count;
          this->count = iVar3 + 1;
          this->row_numbers[iVar3] = uVar1 + iVar2;
          uVar6 = uVar6 + 1;
        } while (uVar6 < info->count);
      }
    }
    Flush(this);
  }
  return;
}

Assistant:

void CleanupState::CleanupDelete(DeleteInfo &info) {
	auto version_table = info.table;
	if (!version_table->HasIndexes()) {
		// this table has no indexes: no cleanup to be done
		return;
	}

	if (current_table != version_table) {
		// table for this entry differs from previous table: flush and switch to the new table
		Flush();
		current_table = version_table;
	}

	// possibly vacuum any indexes in this table later
	indexed_tables[current_table->GetTableName()] = current_table;

	count = 0;
	if (info.is_consecutive) {
		for (idx_t i = 0; i < info.count; i++) {
			row_numbers[count++] = UnsafeNumericCast<int64_t>(info.base_row + i);
		}
	} else {
		auto rows = info.GetRows();
		for (idx_t i = 0; i < info.count; i++) {
			row_numbers[count++] = UnsafeNumericCast<int64_t>(info.base_row + rows[i]);
		}
	}
	Flush();
}